

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

void b_array::copy_array<Map::Pair<std::__cxx11::string,sql_parser::Keyword>>
               (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *src,Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                     *dest,size_t src_size,size_t *dest_size)

{
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *pPVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *pPVar2;
  size_t index;
  
  if (src_size != 0) {
    index = 0;
    do {
      pPVar1 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
               ::operator[](src,index);
      pPVar2 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
               ::operator[](dest,index);
      std::__cxx11::string::_M_assign((string *)pPVar2);
      pPVar2->value = pPVar1->value;
      index = index + 1;
    } while (src_size != index);
  }
  *dest_size = src_size;
  return;
}

Assistant:

void copy_array(const b_array::Array<T>& src, b_array::Array<T>& dest, size_t src_size,
                size_t& dest_size) {
    for (size_t i = 0; i < src_size; i++) {
        dest[i] = src[i];
    }
    dest_size = src_size;
}